

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

InstanceBuilder * __thiscall
vkb::InstanceBuilder::enable_layer(InstanceBuilder *this,char *layer_name)

{
  char *local_20;
  char *layer_name_local;
  InstanceBuilder *this_local;
  
  if (layer_name != (char *)0x0) {
    local_20 = layer_name;
    layer_name_local = (char *)this;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&(this->info).layers,&local_20);
  }
  return this;
}

Assistant:

InstanceBuilder& InstanceBuilder::enable_layer(const char* layer_name) {
    if (!layer_name) return *this;
    info.layers.push_back(layer_name);
    return *this;
}